

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layers_unconditional_strided(fasthessian *fh)

{
  int i;
  long lVar1;
  
  for (lVar1 = 1; lVar1 != 5; lVar1 = lVar1 + 1) {
    compute_response_layer_unconditional_strided(fh->response_map[lVar1 + -1],fh->iimage);
  }
  for (lVar1 = 4; lVar1 < fh->total_layers; lVar1 = lVar1 + 1) {
    compute_response_layer_unconditional(fh->response_map[lVar1],fh->iimage);
  }
  return;
}

Assistant:

void compute_response_layers_unconditional_strided(struct fasthessian* fh){

    for (int i = 0; i < 4; ++i) {
		compute_response_layer_unconditional_strided(fh->response_map[i], fh->iimage);
	}
    for (int i = 4; i < fh->total_layers; ++i) {
		compute_response_layer_unconditional(fh->response_map[i], fh->iimage);
	}
}